

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::
     WriteConstantDelta(int constant,uint frame_of_reference,idx_t count,uint *values,bool *validity
                       ,void *data_ptr)

{
  uint in_ESI;
  int in_EDI;
  BitpackingCompressionState<unsigned_int,_true,_int> *in_R8;
  BitpackingCompressionState<unsigned_int,_true,_int> *in_R9;
  BitpackingCompressionState<unsigned_int,_true,_int> *state;
  idx_t in_stack_ffffffffffffffc8;
  BitpackingCompressionState<unsigned_int,_true,_int> *pBVar1;
  
  pBVar1 = in_R9;
  ReserveSpace(in_R9,in_stack_ffffffffffffffc8);
  WriteMetaData(in_R8,(BitpackingMode)((ulong)pBVar1 >> 0x38));
  WriteData<unsigned_int>(&in_R9->data_ptr,in_ESI);
  WriteData<int>(&in_R9->data_ptr,in_EDI);
  UpdateStats(in_R9,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}